

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty_test.cc
# Opt level: O2

void __thiscall
BloatyTest_SimpleSharedObjectFile_Test::BloatyTest_SimpleSharedObjectFile_Test
          (BloatyTest_SimpleSharedObjectFile_Test *this)

{
  BloatyTest::BloatyTest(&this->super_BloatyTest);
  (this->super_BloatyTest).super_Test._vptr_Test = (_func_int **)&PTR__BloatyTest_005fecd8;
  return;
}

Assistant:

TEST_F(BloatyTest, SimpleSharedObjectFile) {
  std::string file = "04-simple.so";
  uint64_t size;
  ASSERT_TRUE(GetFileSize(file, &size));

  RunBloaty({"bloaty", file});
  EXPECT_GT(top_row_->size.vm, 8000);
  EXPECT_LT(top_row_->size.vm, 12000);
  EXPECT_EQ(top_row_->size.file, size);
  EXPECT_GT(top_row_->sorted_children.size(), 3);

  RunBloaty({"bloaty", "-d", "segments", file});
  EXPECT_GT(top_row_->size.vm, 8000);
  EXPECT_LT(top_row_->size.vm, 12000);
  EXPECT_EQ(top_row_->size.file, size);

  RunBloaty({"bloaty", "-d", "symbols", "-n", "50", file});
  AssertChildren(*top_row_, {
    std::make_tuple("bar_x", 4000, 4000),
    std::make_tuple("foo_x", 4000, kUnknown),
    std::make_tuple("bar_func", kUnknown, kSameAsVM),
    std::make_tuple("foo_func", kUnknown, kSameAsVM),
  });
}